

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
libcellml::Parser::ParserImpl::loadEncapsulation(ParserImpl *this,ModelPtr *model,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  ulong *puVar8;
  element_type *peVar9;
  undefined8 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  string textNode;
  IssuePtr issue_3;
  IssuePtr issue;
  XmlNodePtr componentRefNode;
  ComponentPtr parentComponent;
  string encapsulationId;
  NameList usedNames;
  undefined1 local_158 [32];
  string local_138;
  undefined1 local_118 [16];
  element_type local_108;
  IssuePtr local_d8;
  undefined1 local_c8 [24];
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  ComponentPtr local_78;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XmlNode::firstChild((XmlNode *)local_c8);
  do {
    if ((element_type *)local_c8._0_8_ == (element_type *)0x0) {
      if ((pointer)local_c8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      return;
    }
    local_68 = &local_58;
    local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60 = 0;
    local_58 = 0;
    if (this->mParsing20Version == true) {
      bVar2 = XmlNode::isCellml20Element((XmlNode *)local_c8._0_8_,"component_ref");
    }
    else {
      bVar2 = XmlNode::isCellml1XElement((XmlNode *)local_c8._0_8_,"component_ref");
    }
    if (bVar2 == false) {
      bVar3 = XmlNode::isText((XmlNode *)local_c8._0_8_);
      if (!bVar3) {
        bVar3 = XmlNode::isComment((XmlNode *)local_c8._0_8_);
        if ((bVar3) ||
           ((this->mParsing1XVersion == true &&
            (bVar3 = XmlNode::isCellml1XElement((XmlNode *)local_c8._0_8_,"relationship_ref"), bVar3
            )))) goto LAB_0024156f;
        Issue::IssueImpl::create();
        pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl;
        NamedEntity::name_abi_cxx11_
                  ((string *)&local_98,
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2b44cb);
        local_108.super_ImportedEntity._vptr_ImportedEntity =
             (_func_int **)&local_108.super_enable_shared_from_this<libcellml::Component>;
        plVar7 = plVar5 + 2;
        if ((enable_shared_from_this<libcellml::Component> *)*plVar5 ==
            (enable_shared_from_this<libcellml::Component> *)plVar7) {
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar7;
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[3];
        }
        else {
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar7;
          local_108.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*plVar5;
        }
        local_108.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_108.super_ImportedEntity);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138.field_2._8_8_ = plVar5[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_138._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        XmlNode::name_abi_cxx11_((string *)(local_c8 + 0x10),(XmlNode *)local_c8._0_8_);
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          uVar10 = local_138.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_138._M_string_length + local_b0) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._16_8_ != &local_a8) {
            uVar10 = local_a8._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_138._M_string_length + local_b0) goto LAB_00241bc5;
          plVar5 = (long *)std::__cxx11::string::replace
                                     ((ulong)(local_c8 + 0x10),0,(char *)0x0,
                                      (ulong)local_138._M_dataplus._M_p);
        }
        else {
LAB_00241bc5:
          plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_138,local_c8._16_8_);
        }
        local_158._0_8_ = local_158 + 0x10;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._24_8_ = plVar5[3];
        }
        else {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._0_8_ = (element_type *)*plVar5;
        }
        local_158._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)
         &(peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_158);
        local_118._0_8_ = &local_108;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity;
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
               = (EntityImpl *)plVar5[3];
        }
        else {
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity;
          local_118._0_8_ = (element_type *)*plVar5;
        }
        local_118._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
        if ((element_type *)local_118._0_8_ != &local_108) {
          operator_delete((void *)local_118._0_8_,
                          (ulong)((long)local_108.super_ComponentEntity.super_NamedEntity.
                                        super_ParentedEntity.super_Entity._vptr_Entity + 1));
        }
        if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._16_8_ != &local_a8) {
          operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((enable_shared_from_this<libcellml::Component> *)
            local_108.super_ImportedEntity._vptr_ImportedEntity !=
            &local_108.super_enable_shared_from_this<libcellml::Component>) {
          operator_delete(local_108.super_ImportedEntity._vptr_ImportedEntity,
                          (ulong)((long)&((local_108.
                                           super_enable_shared_from_this<libcellml::Component>.
                                           _M_weak_this.
                                           super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ComponentEntity).super_NamedEntity.
                                         super_ParentedEntity.super_Entity._vptr_Entity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_allocated_capacity != &local_88) {
          operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1)
          ;
        }
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,model);
        Issue::IssueImpl::setReferenceRule
                  ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl,ENCAPSULATION_CHILD);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
        _Var11._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        goto LAB_00241163;
      }
      XmlNode::convertToString_abi_cxx11_((string *)local_118,(XmlNode *)local_c8._0_8_);
      bVar3 = hasNonWhitespaceCharacters((string *)local_118);
      if (bVar3) {
        Issue::IssueImpl::create();
        pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl;
        NamedEntity::name_abi_cxx11_
                  ((string *)(local_c8 + 0x10),
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        plVar5 = (long *)std::__cxx11::string::replace
                                   ((ulong)(local_c8 + 0x10),0,(char *)0x0,0x2b44cb);
        local_98._M_allocated_capacity = (size_type)&local_88;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar6) {
          local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_88._8_8_ = plVar5[3];
        }
        else {
          local_88._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_98._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
        }
        local_98._8_8_ = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_98._M_local_buf);
        local_108.super_ImportedEntity._vptr_ImportedEntity =
             (_func_int **)&local_108.super_enable_shared_from_this<libcellml::Component>;
        plVar7 = plVar5 + 2;
        if ((enable_shared_from_this<libcellml::Component> *)*plVar5 ==
            (enable_shared_from_this<libcellml::Component> *)plVar7) {
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar7;
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[3];
        }
        else {
          local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
          super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar7;
          local_108.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*plVar5;
        }
        local_108.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_108.super_ImportedEntity,local_118._0_8_);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138.field_2._8_8_ = plVar5[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = *puVar8;
          local_138._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_138._M_string_length = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_158._0_8_ = local_158 + 0x10;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._24_8_ = plVar5[3];
        }
        else {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._0_8_ = (element_type *)*plVar5;
        }
        local_158._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar1,(string *)local_158);
        if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((enable_shared_from_this<libcellml::Component> *)
            local_108.super_ImportedEntity._vptr_ImportedEntity !=
            &local_108.super_enable_shared_from_this<libcellml::Component>) {
          operator_delete(local_108.super_ImportedEntity._vptr_ImportedEntity,
                          (ulong)((long)&((local_108.
                                           super_enable_shared_from_this<libcellml::Component>.
                                           _M_weak_this.
                                           super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_ComponentEntity).super_NamedEntity.
                                         super_ParentedEntity.super_Entity._vptr_Entity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_allocated_capacity != &local_88) {
          operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._16_8_ != &local_a8) {
          operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,model);
        Issue::IssueImpl::setReferenceRule
                  ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
        _Var11._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
      else {
        XmlNode::next((XmlNode *)local_158);
        uVar10 = local_c8._8_8_;
        local_c8._8_8_ = local_158._8_8_;
        local_c8._0_8_ = local_158._0_8_;
        local_158._0_8_ = (element_type *)0x0;
        local_158._8_8_ = (pointer)0x0;
        _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
        if ((pointer)uVar10 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
          _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
        }
      }
      if ((pointer)_Var11._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
      }
      if ((element_type *)local_118._0_8_ != &local_108) {
        operator_delete((void *)local_118._0_8_,
                        (ulong)((long)local_108.super_ComponentEntity.super_NamedEntity.
                                      super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if (bVar3) goto LAB_0024156f;
    }
    else {
      loadComponentRef((ParserImpl *)local_118,(ModelPtr *)this,(XmlNodePtr *)model,
                       (NameList *)local_c8);
      this_00._M_pi =
           local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
      local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_118._0_8_;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (pointer)0x0;
      _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
      if ((pointer)this_00._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
      }
LAB_00241163:
      if ((pointer)_Var11._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
      }
LAB_0024156f:
      if (local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        if (bVar2 == false) goto LAB_00241a5d;
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 (((weak_ptr<libcellml::Component> *)
                  local_108.super_ImportedEntity._vptr_ImportedEntity)->
                 super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        NamedEntity::name_abi_cxx11_
                  (&local_138,
                   (NamedEntity *)
                   (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x2b44cb);
        local_158._0_8_ = local_158 + 0x10;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._24_8_ = plVar5[3];
        }
        else {
          local_158._16_8_ =
               (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_158._0_8_ = (element_type *)*plVar5;
        }
        local_158._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append(local_158);
        local_118._0_8_ = &local_108;
        peVar9 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar9) {
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity;
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
               = (EntityImpl *)plVar5[3];
        }
        else {
          local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
          _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                         super_Entity._vptr_Entity;
          local_118._0_8_ = (element_type *)*plVar5;
        }
        local_118._8_8_ = plVar5[1];
        *plVar5 = (long)peVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
        if ((element_type *)local_118._0_8_ != &local_108) {
          operator_delete((void *)local_118._0_8_,
                          (ulong)((long)local_108.super_ComponentEntity.super_NamedEntity.
                                        super_ParentedEntity.super_Entity._vptr_Entity + 1));
        }
        if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)
                     &(((weak_ptr<libcellml::Component> *)
                       local_108.super_ImportedEntity._vptr_ImportedEntity)->
                      super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi[2]._M_use_count,model);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   (((weak_ptr<libcellml::Component> *)
                    local_108.super_ImportedEntity._vptr_ImportedEntity)->
                   super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                   _M_pi,ENCAPSULATION_CHILD);
        Logger::LoggerImpl::addIssue
                  (&this->super_LoggerImpl,(IssuePtr *)&local_108.super_ImportedEntity);
        _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_108.super_ImportedEntity.mPimpl;
LAB_00241a53:
        if ((ImportedEntityImpl *)_Var11._M_pi != (ImportedEntityImpl *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
        }
      }
      else {
        ComponentEntity::addComponent
                  (&((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_ComponentEntity,&local_78);
        sVar4 = ComponentEntity::componentCount
                          (&(local_78.
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_ComponentEntity);
        if (sVar4 == 0) {
          Issue::IssueImpl::create();
          pIVar1 = (local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    ((string *)&local_98,
                     (NamedEntity *)
                     (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x2b44cb);
          local_108.super_ImportedEntity._vptr_ImportedEntity =
               (_func_int **)&local_108.super_enable_shared_from_this<libcellml::Component>;
          plVar7 = plVar5 + 2;
          if ((enable_shared_from_this<libcellml::Component> *)*plVar5 ==
              (enable_shared_from_this<libcellml::Component> *)plVar7) {
            local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
            super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
            local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
            super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[3];
          }
          else {
            local_108.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
            super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar7;
            local_108.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*plVar5;
          }
          local_108.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)plVar5[1];
          *plVar5 = (long)plVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_108.super_ImportedEntity);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          puVar8 = (ulong *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar8) {
            local_138.field_2._M_allocated_capacity = *puVar8;
            local_138.field_2._8_8_ = plVar5[3];
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar8;
            local_138._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_138._M_string_length = plVar5[1];
          *plVar5 = (long)puVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NamedEntity::name_abi_cxx11_
                    ((string *)(local_c8 + 0x10),
                     (NamedEntity *)
                     local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            uVar10 = local_138.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_138._M_string_length + local_b0) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._16_8_ != &local_a8) {
              uVar10 = local_a8._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_138._M_string_length + local_b0) goto LAB_00241768;
            plVar5 = (long *)std::__cxx11::string::replace
                                       ((ulong)(local_c8 + 0x10),0,(char *)0x0,
                                        (ulong)local_138._M_dataplus._M_p);
          }
          else {
LAB_00241768:
            plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_138,local_c8._16_8_);
          }
          local_158._0_8_ = local_158 + 0x10;
          peVar9 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar9) {
            local_158._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            local_158._24_8_ = plVar5[3];
          }
          else {
            local_158._16_8_ =
                 (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity;
            local_158._0_8_ = (element_type *)*plVar5;
          }
          local_158._8_8_ = plVar5[1];
          *plVar5 = (long)peVar9;
          plVar5[1] = 0;
          *(undefined1 *)
           &(peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = 0;
          plVar5 = (long *)std::__cxx11::string::append(local_158);
          local_118._0_8_ = &local_108;
          peVar9 = (element_type *)(plVar5 + 2);
          if ((element_type *)*plVar5 == peVar9) {
            local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                           super_Entity._vptr_Entity;
            local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            mPimpl = (EntityImpl *)plVar5[3];
          }
          else {
            local_108.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
            _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                           super_Entity._vptr_Entity;
            local_118._0_8_ = (element_type *)*plVar5;
          }
          local_118._8_8_ = plVar5[1];
          *plVar5 = (long)peVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar1,(string *)local_118);
          if ((element_type *)local_118._0_8_ != &local_108) {
            operator_delete((void *)local_118._0_8_,
                            (ulong)((long)local_108.super_ComponentEntity.super_NamedEntity.
                                          super_ParentedEntity.super_Entity._vptr_Entity + 1));
          }
          if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,(ulong)(local_158._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._16_8_ != &local_a8) {
            operator_delete((void *)local_c8._16_8_,local_a8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((enable_shared_from_this<libcellml::Component> *)
              local_108.super_ImportedEntity._vptr_ImportedEntity !=
              &local_108.super_enable_shared_from_this<libcellml::Component>) {
            operator_delete(local_108.super_ImportedEntity._vptr_ImportedEntity,
                            (ulong)((long)&((local_108.
                                             super_enable_shared_from_this<libcellml::Component>.
                                             _M_weak_this.
                                             super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super_ComponentEntity).super_NamedEntity.
                                           super_ParentedEntity.super_Entity._vptr_Entity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity,
                            local_88._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,model);
          Issue::IssueImpl::setReferenceRule
                    ((local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,ENCAPSULATION_CHILD);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_d8);
          _Var11._M_pi = local_d8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          goto LAB_00241a53;
        }
      }
LAB_00241a5d:
      XmlNode::next((XmlNode *)local_118);
      uVar10 = local_c8._8_8_;
      local_c8._8_8_ = local_118._8_8_;
      local_c8._0_8_ = local_118._0_8_;
      local_118._0_8_ = (element_type *)0x0;
      local_118._8_8_ = (pointer)0x0;
      if ((pointer)uVar10 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10);
      }
      if ((pointer)local_118._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
    }
    if ((pointer)local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  } while( true );
}

Assistant:

void Parser::ParserImpl::loadEncapsulation(const ModelPtr &model, const XmlNodePtr &node)
{
    NameList usedNames;
    XmlNodePtr componentRefNode = node->firstChild();
    while (componentRefNode != nullptr) {
        ComponentPtr parentComponent = nullptr;
        std::string encapsulationId;
        bool haveComponentRef = false;
        if (parseNode(componentRefNode, "component_ref")) {
            haveComponentRef = true;
            parentComponent = loadComponentRef(model, componentRefNode, usedNames);
        } else if (componentRefNode->isText()) {
            const std::string textNode = componentRefNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            } else {
                // Continue to next node if this is whitespace (don't try to parse children of whitespace).
                componentRefNode = componentRefNode->next();
                continue;
            }
        } else if (componentRefNode->isComment()) {
            // Do nothing.
        } else if (mParsing1XVersion && componentRefNode->isCellml1XElement("relationship_ref")) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + componentRefNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        // Add the parentComponent to the model with its child(ren) encapsulated.
        if (parentComponent) {
            model->addComponent(parentComponent);
            if (parentComponent->componentCount() == 0) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponent->name() + "' as a parent component_ref but it does not have any children.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                addIssue(issue);
            }
        } else if (haveComponentRef) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies an invalid parent component_ref that also does not have any children.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
            addIssue(issue);
        }

        componentRefNode = componentRefNode->next();
    }
}